

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O2

void __thiscall Assembler::Assembler(Assembler *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l;
  allocator_type local_4aa;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_4a9;
  int local_4a8 [26];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_440;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_418;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_3c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_378;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_350;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_328;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_300;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_2d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_288;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  
  (this->inputFileName)._M_dataplus._M_p = (pointer)&(this->inputFileName).field_2;
  (this->inputFileName)._M_string_length = 0;
  (this->inputFileName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->outputFileName,"out.o",(allocator<char> *)&local_440);
  (this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->symbolTable)._M_t._M_impl.super__Rb_tree_header;
  (this->symbolTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->symbolTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->symbolTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->symbolTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->symbolTable)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->relocationTable)._M_t._M_impl.super__Rb_tree_header;
  (this->relocationTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->relocationTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->relocationTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->relocationTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->relocationTable)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->codeBySection)._M_t._M_impl.super__Rb_tree_header;
  (this->codeBySection)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->codeBySection)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->codeBySection)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->codeBySection)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->codeBySection)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4a8[0x19] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_440,(char (*) [5])"halt",local_4a8 + 0x19);
  local_4a8[0x18] = 0x20;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_418,(char (*) [5])"iret",local_4a8 + 0x18);
  local_4a8[0x17] = 0x40;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_3f0,(char (*) [4])0x11c31e,local_4a8 + 0x17);
  local_4a8[0x16] = 0x10;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_3c8,(char (*) [4])0x11caa1,local_4a8 + 0x16);
  local_4a8[0x15] = 0x30;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_3a0,(char (*) [5])"call",local_4a8 + 0x15);
  local_4a8[0x14] = 0x50;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_378,(char (*) [4])"jmp",local_4a8 + 0x14);
  local_4a8[0x13] = 0x51;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_350,(char (*) [4])"jeq",local_4a8 + 0x13);
  local_4a8[0x12] = 0x52;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_328,(char (*) [4])"jne",local_4a8 + 0x12);
  local_4a8[0x11] = 0x53;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_300,(char (*) [4])"jgt",local_4a8 + 0x11);
  local_4a8[0x10] = 0xa0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_2d8,(char (*) [4])"ldr",local_4a8 + 0x10);
  local_4a8[0xf] = 0x91;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_2b0,(char (*) [4])"shr",local_4a8 + 0xf);
  local_4a8[0xe] = 0xb0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_288,(char (*) [4])"str",local_4a8 + 0xe);
  local_4a8[0xd] = 0xb0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_260,(char (*) [5])"push",local_4a8 + 0xd);
  local_4a8[0xc] = 0xa0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_238,(char (*) [4])"pop",local_4a8 + 0xc);
  local_4a8[0xb] = 0x60;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_210,(char (*) [5])"xchg",local_4a8 + 0xb);
  local_4a8[10] = 0x70;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_1e8,(char (*) [4])"add",local_4a8 + 10);
  local_4a8[9] = 0x71;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_1c0,(char (*) [4])"sub",local_4a8 + 9);
  local_4a8[8] = 0x72;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_198,(char (*) [4])"mul",local_4a8 + 8);
  local_4a8[7] = 0x73;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_170,(char (*) [4])"div",local_4a8 + 7);
  local_4a8[6] = 0x74;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_148,(char (*) [4])"cmp",local_4a8 + 6);
  local_4a8[5] = 0x80;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_120,(char (*) [4])"not",local_4a8 + 5);
  local_4a8[4] = 0x81;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_f8,(char (*) [4])0x11cc97,local_4a8 + 4);
  local_4a8[3] = 0x82;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[3],_int,_true>(&local_d0,(char (*) [3])0x11c36d,local_4a8 + 3);
  local_4a8[2] = 0x83;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_a8,(char (*) [4])"xor",local_4a8 + 2);
  local_4a8[1] = 0x84;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_80,(char (*) [5])"test",local_4a8 + 1);
  local_4a8[0] = 0x90;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(&local_58,(char (*) [4])"shl",local_4a8);
  __l._M_len = 0x1a;
  __l._M_array = &local_440;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->instrDescription,__l,&local_4a9,&local_4aa);
  lVar2 = 1000;
  do {
    std::__cxx11::string::~string((string *)((long)&local_440.first._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  this->isLabelWithoutCode = false;
  return;
}

Assistant:

Assembler() {
        isLabelWithoutCode = false;
    }